

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Crop_x86_fma::forward
          (Crop_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 *puVar1;
  int iVar2;
  Mat *pMVar3;
  int *piVar4;
  void *pvVar5;
  long *plVar6;
  Allocator *pAVar7;
  ulong uVar8;
  size_t sVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined8 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  bool bVar28;
  int iVar29;
  Allocator *pAVar30;
  pointer pMVar31;
  int iVar32;
  pointer pMVar33;
  sbyte sVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  Mat *pMVar39;
  uint uVar40;
  int iVar41;
  Allocator **unaff_R14;
  bool bVar42;
  bool bVar43;
  Mat m;
  int _outw;
  int _outh;
  int _woffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int iStack_120;
  Allocator *local_118;
  int iStack_110;
  int iStack_10c;
  int iStack_108;
  int iStack_104;
  int iStack_100;
  size_t local_f8;
  int _outc;
  int _outd;
  int _hoffset;
  Mat *local_d8;
  uint local_d0;
  int local_cc;
  Option *local_c8;
  uint local_c0;
  int _coffset;
  int local_b8;
  int _doffset;
  size_t local_b0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs_unpacked;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_d0 = pMVar3->w;
  local_c0 = pMVar3->h;
  iVar32 = pMVar3->d;
  local_b8 = pMVar3->c;
  local_cc = pMVar3->dims;
  local_b0 = pMVar3->elemsize;
  iVar2 = pMVar3->elempack;
  pMVar39 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_d8 = pMVar39;
  local_c8 = opt;
  if (((this->super_Crop).starts_expr._M_string_length != 0) &&
     ((this->super_Crop).ends_expr._M_string_length != 0)) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blob_shapes,
               ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar3 >> 3) *
               -0x71c71c71c71c71c7,(allocator_type *)&m);
    pMVar33 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar33) {
      unaff_R14 = &m.allocator;
      lVar36 = 0;
      uVar38 = 0;
      do {
        pMVar31 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        switch(*(undefined4 *)((long)&pMVar33->dims + lVar36)) {
        case 1:
          m.cstep = (long)*(int *)((long)&pMVar33->elempack + lVar36) *
                    (long)*(int *)((long)&pMVar33->w + lVar36);
          m.dims = 1;
          m.w = (int)m.cstep;
          m.h = 1;
          break;
        case 2:
          m.w = *(int *)((long)&pMVar33->w + lVar36);
          lVar37 = (long)*(int *)((long)&pMVar33->elempack + lVar36) *
                   (long)*(int *)((long)&pMVar33->h + lVar36);
          m.dims = 2;
          m.h = (int)lVar37;
          m.cstep = lVar37 * m.w;
          break;
        case 3:
          m.w = *(int *)((long)&pMVar33->w + lVar36);
          m.h = *(int *)((long)&pMVar33->h + lVar36);
          m.c = *(int *)((long)&pMVar33->elempack + lVar36) * *(int *)((long)&pMVar33->c + lVar36);
          m.dims = 3;
          m.d = 1;
          lVar37 = (long)m.h * (long)m.w;
          goto LAB_0028dcb1;
        case 4:
          m.w = *(int *)((long)&pMVar33->w + lVar36);
          m.h = *(int *)((long)&pMVar33->h + lVar36);
          m.d = *(int *)((long)&pMVar33->d + lVar36);
          m.c = *(int *)((long)&pMVar33->elempack + lVar36) * *(int *)((long)&pMVar33->c + lVar36);
          m.dims = 4;
          lVar37 = (long)m.h * (long)m.w * (long)m.d;
LAB_0028dcb1:
          m.elempack = 1;
          m.elemsize._0_4_ = 4;
          m.cstep = lVar37 + 3U & 0x3ffffffffffffffc;
          goto LAB_0028dd46;
        default:
          m.cstep = 0;
          m.elemsize._0_4_ = 0;
          m.elempack = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          m.dims = 0;
          m.w = 0;
          goto LAB_0028dd46;
        }
        m.c = 1;
        m.d = 1;
        m.elempack = 1;
        m.elemsize._0_4_ = 4;
LAB_0028dd46:
        m.elemsize._4_4_ = 0;
        m.refcount._4_4_ = 0;
        m.refcount._0_4_ = 0;
        m.allocator = (Allocator *)0x0;
        m.data = (void *)0x0;
        pMVar39 = (Mat *)((long)&(bottom_blob_shapes.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_start)->data + lVar36);
        if (pMVar39 != &m) {
          piVar4 = *(int **)((long)&(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->refcount + lVar36);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = *(void **)((long)&(bottom_blob_shapes.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->data + lVar36);
              plVar6 = *(long **)((long)&(bottom_blob_shapes.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->allocator +
                                 lVar36);
              if (plVar6 == (long *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (**(code **)(*plVar6 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar31->cstep + lVar36) = 0;
          *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
          pMVar39->data = (void *)0x0;
          pMVar39->refcount = (int *)0x0;
          puVar1 = (undefined8 *)((long)&pMVar31->dims + lVar36);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&pMVar31->c + lVar36) = 0;
          puVar1 = (undefined8 *)((long)&pMVar31->data + lVar36);
          *puVar1 = m.data;
          puVar1[1] = CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          *(ulong *)((long)&pMVar31->elemsize + lVar36) = CONCAT44(m.elemsize._4_4_,(int)m.elemsize)
          ;
          *(int *)((long)&pMVar31->elempack + lVar36) = m.elempack;
          *(Allocator **)((long)&pMVar31->allocator + lVar36) = m.allocator;
          puVar1 = (undefined8 *)((long)&pMVar31->dims + lVar36);
          *puVar1 = CONCAT44(m.w,m.dims);
          puVar1[1] = CONCAT44(m.d,m.h);
          *(int *)((long)&pMVar31->c + lVar36) = m.c;
          *(size_t *)((long)&pMVar31->cstep + lVar36) = m.cstep;
        }
        piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        uVar38 = uVar38 + 1;
        pMVar33 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar36 = lVar36 + 0x48;
      } while (uVar38 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar33 >>
                                3) * -0x71c71c71c71c71c7));
    }
    Crop::eval_crop_expr
              (&this->super_Crop,&bottom_blob_shapes,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,
               &_outh,&_outd,&_outc);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
    pMVar39 = local_d8;
    goto LAB_0028df38;
  }
  if ((this->super_Crop).woffset != -0xe9) {
    switch(pMVar3->dims) {
    case 1:
      m.cstep = (long)pMVar3->elempack * (long)pMVar3->w;
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      m.dims = 1;
      m.w = (int)m.cstep;
      m.h = 1;
      m.d = 1;
      m.c = 1;
      break;
    case 2:
      m.w = pMVar3->w;
      lVar36 = (long)pMVar3->elempack * (long)pMVar3->h;
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
      m.dims = 2;
      m.h = (int)lVar36;
      m.d = 1;
      m.c = 1;
      m.cstep = lVar36 * m.w;
      break;
    case 3:
      m.w = pMVar3->w;
      m.h = pMVar3->h;
      m.c = pMVar3->elempack * pMVar3->c;
      m.dims = 3;
      m.d = 1;
      lVar36 = (long)m.h * (long)m.w;
      goto LAB_0028e29c;
    case 4:
      m.w = pMVar3->w;
      m.h = pMVar3->h;
      m.d = pMVar3->d;
      m.c = pMVar3->elempack * pMVar3->c;
      m.dims = 4;
      lVar36 = (long)m.h * (long)m.w * (long)m.d;
LAB_0028e29c:
      m.elempack = 1;
      m.elemsize._0_4_ = 4;
      m.cstep = lVar36 + 3U & 0x3ffffffffffffffc;
      break;
    default:
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    switch(pMVar3[1].dims) {
    case 1:
      local_f8 = (long)pMVar3[1].elempack * (long)pMVar3[1].w;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
      iStack_120 = 1;
      iStack_110 = 1;
      iStack_10c = (int)local_f8;
      iStack_108 = 1;
      iStack_104 = 1;
      iStack_100 = 1;
      break;
    case 2:
      iStack_10c = pMVar3[1].w;
      lVar36 = (long)pMVar3[1].elempack * (long)pMVar3[1].h;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
      iStack_120 = 1;
      iStack_110 = 2;
      iStack_108 = (int)lVar36;
      iStack_104 = 1;
      iStack_100 = 1;
      local_f8 = lVar36 * iStack_10c;
      break;
    case 3:
      iStack_10c = pMVar3[1].w;
      iStack_108 = pMVar3[1].h;
      iStack_100 = pMVar3[1].elempack * pMVar3[1].c;
      iStack_110 = 3;
      iStack_104 = 1;
      lVar36 = (long)iStack_108 * (long)iStack_10c;
      goto LAB_0028e5d2;
    case 4:
      iStack_10c = pMVar3[1].w;
      iStack_108 = pMVar3[1].h;
      iStack_104 = pMVar3[1].d;
      iStack_100 = pMVar3[1].elempack * pMVar3[1].c;
      iStack_110 = 4;
      lVar36 = (long)iStack_108 * (long)iStack_10c * (long)iStack_104;
LAB_0028e5d2:
      iStack_120 = 1;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
      local_f8 = lVar36 + 3U & 0x3ffffffffffffffc;
      break;
    default:
      local_f8 = 0;
      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      iStack_120 = 0;
      iStack_110 = 0;
      iStack_10c = 0;
      iStack_108 = 0;
      iStack_104 = 0;
      iStack_100 = 0;
    }
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    local_118 = (Allocator *)0x0;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    unaff_R14 = (Allocator **)&_coffset;
    Crop::resolve_crop_roi
              (&this->super_Crop,&m,(Mat *)&bottom_blob_shapes,&_woffset,&_hoffset,&_doffset,
               (int *)unaff_R14,&_outw,&_outh,&_outd,&_outc);
    piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish._4_4_,
                             bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if ((*piVar4 == 0) &&
         (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0)) {
        free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start);
      }
    }
    piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 != 0) goto LAB_0028df38;
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        goto LAB_0028df38;
      }
      if (m.data == (void *)0x0) goto LAB_0028df38;
      goto LAB_0028e7d3;
    }
    goto LAB_0028df38;
  }
  switch(pMVar3->dims) {
  case 1:
    m.cstep = (long)pMVar3->elempack * (long)pMVar3->w;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 1;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    break;
  case 2:
    m.w = pMVar3->w;
    lVar36 = (long)pMVar3->elempack * (long)pMVar3->h;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 2;
    m.h = (int)lVar36;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar36 * m.w;
    break;
  case 3:
    m.w = pMVar3->w;
    m.h = pMVar3->h;
    m.c = pMVar3->elempack * pMVar3->c;
    m.dims = 3;
    m.d = 1;
    lVar36 = (long)m.h * (long)m.w;
    goto LAB_0028e225;
  case 4:
    m.w = pMVar3->w;
    m.h = pMVar3->h;
    m.d = pMVar3->d;
    m.c = pMVar3->elempack * pMVar3->c;
    m.dims = 4;
    lVar36 = (long)m.h * (long)m.w * (long)m.d;
LAB_0028e225:
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    m.cstep = lVar36 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  unaff_R14 = (Allocator **)&_coffset;
  Crop::resolve_crop_roi
            (&this->super_Crop,&m,(int *)pMVar3[1].data,&_woffset,&_hoffset,&_doffset,
             (int *)unaff_R14,&_outw,&_outh,&_outd,&_outc);
  piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
LAB_0028e7d3:
          unaff_R14 = (Allocator **)&_coffset;
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0028df38:
  iVar35 = (int)unaff_R14;
  if (iVar2 == 8) {
    if (local_cc == 1) {
      uVar40 = _outw & 7;
      bVar42 = (_outw & 3U) == 0;
      iVar41 = 8;
      if (uVar40 != 0) {
        iVar41 = (uint)bVar42 * 3 + 1;
      }
      sVar34 = 3;
      if (uVar40 != 0) {
        sVar34 = bVar42 * '\x02';
      }
      if (_outw / iVar41 == local_d0 && uVar40 == 0) {
        if (pMVar39 != pMVar3) {
          piVar4 = pMVar3->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar39->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = pMVar39->data;
              pAVar7 = pMVar39->allocator;
              if (pAVar7 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outw % (long)iVar41 & 0xffffffff)
                ;
              }
            }
          }
          pMVar39->cstep = 0;
          pMVar39->data = (void *)0x0;
          pMVar39->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
          pMVar39->dims = 0;
          pMVar39->w = 0;
          pMVar39->h = 0;
          pMVar39->d = 0;
          pMVar39->c = 0;
          piVar4 = pMVar3->refcount;
          pMVar39->data = pMVar3->data;
          pMVar39->refcount = piVar4;
          pMVar39->elemsize = pMVar3->elemsize;
          pMVar39->elempack = pMVar3->elempack;
          pMVar39->allocator = pMVar3->allocator;
          iVar35 = pMVar3->w;
          iVar41 = pMVar3->h;
          iVar29 = pMVar3->d;
          pMVar39->dims = pMVar3->dims;
          pMVar39->w = iVar35;
          pMVar39->h = iVar41;
          pMVar39->d = iVar29;
          pMVar39->c = pMVar3->c;
          pMVar39->cstep = pMVar3->cstep;
        }
LAB_0028e851:
        bVar42 = false;
        iVar35 = 0;
      }
      else if (((_outw | _woffset) & 7U) == 0) {
        Mat::create(pMVar39,_outw / iVar41,(local_b0 >> 3) << sVar34,8,local_c8->blob_allocator);
        iVar35 = -100;
        if (pMVar39->data == (void *)0x0) {
          bVar42 = false;
        }
        else {
          bVar42 = false;
          if ((long)pMVar39->c * pMVar39->cstep != 0) {
            iVar35 = _woffset + 7;
            if (-1 < _woffset) {
              iVar35 = _woffset;
            }
            crop_pack8_avx(pMVar3,pMVar39,0,iVar35 >> 3);
            goto LAB_0028e851;
          }
        }
      }
      else {
        bVar42 = true;
      }
      if (!bVar42) {
        return iVar35;
      }
    }
    if (local_cc == 2) {
      sVar34 = 3;
      if ((_outh & 7U) != 0) {
        sVar34 = ((_outh & 3U) == 0) * '\x02';
      }
      if (_outw == local_d0) {
        iVar41 = 8;
        if ((_outh & 7U) != 0) {
          iVar41 = (uint)((_outh & 3U) == 0) * 3 + 1;
        }
        if (((_outh & 7U) != 0) || (_outh / iVar41 != local_c0)) goto LAB_0028e91b;
        if (pMVar39 != pMVar3) {
          piVar4 = pMVar3->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar39->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = pMVar39->data;
              pAVar7 = pMVar39->allocator;
              if (pAVar7 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outh % (long)iVar41 & 0xffffffff)
                ;
              }
            }
          }
          pMVar39->cstep = 0;
          pMVar39->data = (void *)0x0;
          pMVar39->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
          pMVar39->dims = 0;
          pMVar39->w = 0;
          pMVar39->h = 0;
          pMVar39->d = 0;
          pMVar39->c = 0;
          piVar4 = pMVar3->refcount;
          pMVar39->data = pMVar3->data;
          pMVar39->refcount = piVar4;
          pMVar39->elemsize = pMVar3->elemsize;
          pMVar39->elempack = pMVar3->elempack;
          pMVar39->allocator = pMVar3->allocator;
          iVar35 = pMVar3->w;
          iVar41 = pMVar3->h;
          iVar29 = pMVar3->d;
          pMVar39->dims = pMVar3->dims;
          pMVar39->w = iVar35;
          pMVar39->h = iVar41;
          pMVar39->d = iVar29;
          pMVar39->c = pMVar3->c;
          pMVar39->cstep = pMVar3->cstep;
        }
LAB_0028ea0d:
        bVar42 = false;
        iVar35 = 0;
      }
      else {
LAB_0028e91b:
        bVar42 = true;
        if (((_hoffset | _outh) & 7U) == 0) {
          iVar35 = _outh + 7;
          if (-1 < _outh) {
            iVar35 = _outh;
          }
          Mat::create(pMVar39,_outw,iVar35 >> 3,(local_b0 >> 3) << sVar34,8,local_c8->blob_allocator
                     );
          iVar35 = -100;
          if (pMVar39->data == (void *)0x0) {
            bVar42 = false;
          }
          else {
            bVar42 = false;
            if ((long)pMVar39->c * pMVar39->cstep != 0) {
              iVar35 = _hoffset + 7;
              if (-1 < _hoffset) {
                iVar35 = _hoffset;
              }
              crop_pack8_avx(pMVar3,pMVar39,iVar35 >> 3,_woffset);
              goto LAB_0028ea0d;
            }
          }
        }
      }
      if (!bVar42) {
        return iVar35;
      }
    }
    if (local_cc == 3) {
      uVar38 = local_b0 >> 3;
      sVar34 = 3;
      if ((_outc & 7U) != 0) {
        sVar34 = ((_outc & 3U) == 0) * '\x02';
      }
      uVar40 = _outh ^ local_c0 | _outw ^ local_d0;
      bVar42 = uVar40 == 0;
      if (bVar42) {
        iVar41 = 8;
        if ((_outc & 7U) != 0) {
          iVar41 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        if (((_outc & 7U) != 0) || (_outc / iVar41 != local_b8)) goto LAB_0028eaea;
        if (pMVar39 != pMVar3) {
          piVar4 = pMVar3->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar39->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = pMVar39->data;
              pAVar7 = pMVar39->allocator;
              if (pAVar7 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outc % (long)iVar41 & 0xffffffff)
                ;
              }
            }
          }
          pMVar39->cstep = 0;
          pMVar39->data = (void *)0x0;
          pMVar39->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
          pMVar39->dims = 0;
          pMVar39->w = 0;
          pMVar39->h = 0;
          pMVar39->d = 0;
          pMVar39->c = 0;
          piVar4 = pMVar3->refcount;
          pMVar39->data = pMVar3->data;
          pMVar39->refcount = piVar4;
          pMVar39->elemsize = pMVar3->elemsize;
          pMVar39->elempack = pMVar3->elempack;
          pMVar39->allocator = pMVar3->allocator;
          iVar35 = pMVar3->w;
          iVar41 = pMVar3->h;
          iVar29 = pMVar3->d;
          pMVar39->dims = pMVar3->dims;
          pMVar39->w = iVar35;
          pMVar39->h = iVar41;
          pMVar39->d = iVar29;
          pMVar39->c = pMVar3->c;
          pMVar39->cstep = pMVar3->cstep;
        }
        bVar43 = false;
        iVar35 = 0;
      }
      else {
LAB_0028eaea:
        bVar43 = true;
        if (((_coffset | _outc) & 7U) == 0) {
          iVar35 = _coffset + 7;
          if (-1 < _coffset) {
            iVar35 = _coffset;
          }
          iVar41 = _outc + 7;
          if (-1 < _outc) {
            iVar41 = _outc;
          }
          m.c = iVar41 >> 3;
          uVar8 = pMVar3->elemsize;
          m.data = (void *)((long)(iVar35 >> 3) * pMVar3->cstep * uVar8 + (long)pMVar3->data);
          m.elempack = pMVar3->elempack;
          m.allocator = pMVar3->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar8;
          m.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
          uVar11 = pMVar3->dims;
          uVar12 = pMVar3->w;
          uVar13 = pMVar3->h;
          uVar14 = pMVar3->d;
          m.cstep = ((long)pMVar3->d * uVar8 * (long)pMVar3->h * (long)pMVar3->w + 0xf &
                    0xfffffffffffffff0) / uVar8;
          m.dims = uVar11;
          m.w = uVar12;
          m.h = uVar13;
          m.d = uVar14;
          if (bVar42) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_c8->blob_allocator,
                       CONCAT31((int3)(uVar40 >> 8),bVar42),m.allocator);
            pMVar39 = local_d8;
            if (local_d8 != (Mat *)&bottom_blob_shapes) {
              piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = local_d8->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_d8->allocator == (Allocator *)0x0) {
                    if (local_d8->data != (void *)0x0) {
                      free(local_d8->data);
                    }
                  }
                  else {
                    (*local_d8->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar39->cstep = 0;
              pMVar39->data = (void *)0x0;
              pMVar39->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
              pMVar39->dims = 0;
              pMVar39->w = 0;
              pMVar39->h = 0;
              pMVar39->d = 0;
              pMVar39->c = 0;
              pMVar39->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              pMVar39->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              pMVar39->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              pMVar39->elempack = iStack_120;
              pMVar39->allocator = local_118;
              pMVar39->dims = iStack_110;
              pMVar39->w = iStack_10c;
              pMVar39->h = iStack_108;
              pMVar39->d = iStack_104;
              pMVar39->c = iStack_100;
              pMVar39->cstep = local_f8;
            }
            piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_118 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*local_118->_vptr_Allocator[3])();
                }
              }
            }
            iVar35 = -100;
            if ((pMVar39->data != (void *)0x0) && ((long)pMVar39->c * pMVar39->cstep != 0))
            goto LAB_0028ed59;
          }
          else {
LAB_0028ed59:
            iVar35 = _outc + 7;
            if (-1 < _outc) {
              iVar35 = _outc;
            }
            Mat::create(pMVar39,_outw,_outh,iVar35 >> 3,uVar38 << sVar34,8,local_c8->blob_allocator)
            ;
            iVar35 = -100;
            if ((pMVar39->data != (void *)0x0) && ((long)pMVar39->c * pMVar39->cstep != 0)) {
              if (pMVar39->c < 1) {
                iVar35 = 0;
              }
              else {
                lVar36 = 0;
                do {
                  pAVar7 = m.allocator;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(m.cstep * lVar36 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize) +
                                (long)m.data);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                  local_118 = m.allocator;
                  sVar9 = local_d8->elemsize;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(local_d8->cstep * lVar36 * sVar9 + (long)local_d8->data);
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar9;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                       (undefined4)(sVar9 >> 0x20);
                  crop_pack8_avx((Mat *)&bottom_blob_shapes,(Mat *)&bottom_blobs_unpacked,_hoffset,
                                 _woffset);
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (pAVar7 == (Allocator *)0x0) {
                        if (bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar7->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_f8 = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  iStack_120 = 0;
                  iStack_110 = 0;
                  iStack_10c = 0;
                  iStack_108 = 0;
                  iStack_104 = 0;
                  iStack_100 = 0;
                  lVar36 = lVar36 + 1;
                } while (lVar36 < local_d8->c);
                iVar35 = 0;
                pMVar39 = local_d8;
              }
            }
          }
          piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar43 = false;
        }
      }
      if (!bVar43) {
        return iVar35;
      }
    }
    if (local_cc == 4) {
      uVar38 = local_b0 >> 3;
      sVar34 = 3;
      if ((_outc & 7U) != 0) {
        sVar34 = ((_outc & 3U) == 0) * '\x02';
      }
      uVar40 = _outh ^ local_c0 | _outw ^ local_d0;
      bVar42 = _outd == iVar32;
      bVar43 = uVar40 == 0;
      if (bVar42 && bVar43) {
        iVar41 = 8;
        if ((_outc & 7U) != 0) {
          iVar41 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        if (((_outc & 7U) != 0) || (_outc / iVar41 != local_b8)) goto LAB_0028f17a;
        if (pMVar39 != pMVar3) {
          piVar4 = pMVar3->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar39->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = pMVar39->data;
              pAVar7 = pMVar39->allocator;
              if (pAVar7 == (Allocator *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outc % (long)iVar41 & 0xffffffff)
                ;
              }
            }
          }
          pMVar39->cstep = 0;
          pMVar39->data = (void *)0x0;
          pMVar39->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
          pMVar39->dims = 0;
          pMVar39->w = 0;
          pMVar39->h = 0;
          pMVar39->d = 0;
          pMVar39->c = 0;
          piVar4 = pMVar3->refcount;
          pMVar39->data = pMVar3->data;
          pMVar39->refcount = piVar4;
          pMVar39->elemsize = pMVar3->elemsize;
          pMVar39->elempack = pMVar3->elempack;
          pMVar39->allocator = pMVar3->allocator;
          iVar35 = pMVar3->w;
          iVar41 = pMVar3->h;
          iVar29 = pMVar3->d;
          pMVar39->dims = pMVar3->dims;
          pMVar39->w = iVar35;
          pMVar39->h = iVar41;
          pMVar39->d = iVar29;
          pMVar39->c = pMVar3->c;
          pMVar39->cstep = pMVar3->cstep;
        }
        bVar28 = false;
        iVar35 = 0;
      }
      else {
LAB_0028f17a:
        bVar28 = true;
        if (((_coffset | _outc) & 7U) == 0) {
          iVar35 = _coffset + 7;
          if (-1 < _coffset) {
            iVar35 = _coffset;
          }
          iVar41 = _outc + 7;
          if (-1 < _outc) {
            iVar41 = _outc;
          }
          m.c = iVar41 >> 3;
          uVar8 = pMVar3->elemsize;
          m.data = (void *)((long)(iVar35 >> 3) * pMVar3->cstep * uVar8 + (long)pMVar3->data);
          m.elempack = pMVar3->elempack;
          m.allocator = pMVar3->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar8;
          m.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
          uVar20 = pMVar3->dims;
          uVar21 = pMVar3->w;
          uVar22 = pMVar3->h;
          uVar23 = pMVar3->d;
          m.cstep = ((long)pMVar3->d * uVar8 * (long)pMVar3->h * (long)pMVar3->w + 0xf &
                    0xfffffffffffffff0) / uVar8;
          m.dims = uVar20;
          m.w = uVar21;
          m.h = uVar22;
          m.d = uVar23;
          if (bVar42 && bVar43) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_c8->blob_allocator,
                       CONCAT31((int3)(uVar40 >> 8),bVar42 && bVar43),m.allocator);
            pMVar39 = local_d8;
            if (local_d8 != (Mat *)&bottom_blob_shapes) {
              piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = local_d8->refcount;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (local_d8->allocator == (Allocator *)0x0) {
                    if (local_d8->data != (void *)0x0) {
                      free(local_d8->data);
                    }
                  }
                  else {
                    (*local_d8->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar39->cstep = 0;
              pMVar39->data = (void *)0x0;
              pMVar39->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
              pMVar39->dims = 0;
              pMVar39->w = 0;
              pMVar39->h = 0;
              pMVar39->d = 0;
              pMVar39->c = 0;
              pMVar39->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              pMVar39->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              pMVar39->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              pMVar39->elempack = iStack_120;
              pMVar39->allocator = local_118;
              pMVar39->dims = iStack_110;
              pMVar39->w = iStack_10c;
              pMVar39->h = iStack_108;
              pMVar39->d = iStack_104;
              pMVar39->c = iStack_100;
              pMVar39->cstep = local_f8;
            }
            piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_118 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*local_118->_vptr_Allocator[3])();
                }
              }
            }
            iVar35 = -100;
            if ((pMVar39->data != (void *)0x0) && ((long)pMVar39->c * pMVar39->cstep != 0))
            goto LAB_0028f3e9;
          }
          else {
LAB_0028f3e9:
            iVar35 = _outc + 7;
            if (-1 < _outc) {
              iVar35 = _outc;
            }
            Mat::create(pMVar39,_outw,_outh,_outd,iVar35 >> 3,uVar38 << sVar34,8,
                        local_c8->blob_allocator);
            iVar35 = -100;
            if ((pMVar39->data != (void *)0x0) && ((long)pMVar39->c * pMVar39->cstep != 0)) {
              if (pMVar39->c < 1) {
                iVar35 = 0;
              }
              else {
                lVar36 = 0;
                do {
                  if (0 < _outd) {
                    lVar37 = 0;
                    do {
                      pAVar30 = m.allocator;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)((long)m.data +
                                    (long)(_doffset + (int)lVar37) *
                                    CONCAT44(m.elemsize._4_4_,(int)m.elemsize) *
                                    (long)m.h * (long)m.w +
                                    m.cstep * lVar36 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize));
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                      local_118 = m.allocator;
                      sVar9 = local_d8->elemsize;
                      pAVar7 = local_d8->allocator;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)((long)local_d8->data +
                                    lVar37 * sVar9 * (long)local_d8->h * (long)local_d8->w +
                                    local_d8->cstep * lVar36 * sVar9);
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar9;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(sVar9 >> 0x20);
                      crop_pack8_avx((Mat *)&bottom_blob_shapes,(Mat *)&bottom_blobs_unpacked,
                                     _hoffset,_woffset);
                      piVar4 = (int *)CONCAT44(bottom_blobs_unpacked.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                               bottom_blobs_unpacked.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 == 0) {
                          if (pAVar7 == (Allocator *)0x0) {
                            if (bottom_blobs_unpacked.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              free(bottom_blobs_unpacked.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start);
                            }
                          }
                          else {
                            (*pAVar7->_vptr_Allocator[3])();
                          }
                        }
                      }
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                      bottom_blobs_unpacked.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                               bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                      if (piVar4 != (int *)0x0) {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 == 0) {
                          if (pAVar30 == (Allocator *)0x0) {
                            if (bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              free(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start);
                            }
                          }
                          else {
                            (*pAVar30->_vptr_Allocator[3])();
                          }
                        }
                      }
                      local_f8 = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      iStack_120 = 0;
                      iStack_110 = 0;
                      iStack_10c = 0;
                      iStack_108 = 0;
                      iStack_104 = 0;
                      iStack_100 = 0;
                      lVar37 = lVar37 + 1;
                    } while (lVar37 < _outd);
                  }
                  lVar36 = lVar36 + 1;
                } while (lVar36 < local_d8->c);
                iVar35 = 0;
                pMVar39 = local_d8;
              }
            }
          }
          piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar28 = false;
        }
      }
      if (!bVar28) {
        return iVar35;
      }
    }
  }
  if (iVar2 != 4) goto LAB_002906fb;
  if (local_cc == 1) {
    uVar40 = _outw & 3;
    iVar41 = (uint)(uVar40 == 0) * 3 + 1;
    if (_outw / iVar41 == local_d0 && uVar40 == 0) {
      if (pMVar39 != pMVar3) {
        piVar4 = pMVar3->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar39->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = pMVar39->data;
            pAVar7 = pMVar39->allocator;
            if (pAVar7 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outw % (long)iVar41 & 0xffffffff);
            }
          }
        }
        pMVar39->cstep = 0;
        pMVar39->data = (void *)0x0;
        pMVar39->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
        pMVar39->dims = 0;
        pMVar39->w = 0;
        pMVar39->h = 0;
        pMVar39->d = 0;
        pMVar39->c = 0;
        piVar4 = pMVar3->refcount;
        pMVar39->data = pMVar3->data;
        pMVar39->refcount = piVar4;
        pMVar39->elemsize = pMVar3->elemsize;
        pMVar39->elempack = pMVar3->elempack;
        pMVar39->allocator = pMVar3->allocator;
        iVar35 = pMVar3->w;
        iVar41 = pMVar3->h;
        iVar29 = pMVar3->d;
        pMVar39->dims = pMVar3->dims;
        pMVar39->w = iVar35;
        pMVar39->h = iVar41;
        pMVar39->d = iVar29;
        pMVar39->c = pMVar3->c;
        pMVar39->cstep = pMVar3->cstep;
      }
LAB_0028f8b0:
      bVar42 = false;
      iVar35 = 0;
    }
    else {
      bVar42 = true;
      if (((_outw | _woffset) & 3U) == 0) {
        Mat::create(pMVar39,_outw / iVar41,(local_b0 >> 2) << (uVar40 == 0) * '\x02',iVar41,
                    local_c8->blob_allocator);
        iVar35 = -100;
        if (pMVar39->data == (void *)0x0) {
          bVar42 = false;
        }
        else {
          bVar42 = false;
          if ((long)pMVar39->c * pMVar39->cstep != 0) {
            iVar35 = _woffset + 3;
            if (-1 < _woffset) {
              iVar35 = _woffset;
            }
            crop_pack4_sse(pMVar3,pMVar39,0,iVar35 >> 2);
            goto LAB_0028f8b0;
          }
        }
      }
    }
    if (!bVar42) {
      return iVar35;
    }
  }
  if (local_cc == 2) {
    bVar42 = (_outh & 3U) == 0;
    iVar41 = (uint)bVar42 * 3 + 1;
    if (_outw == local_d0) {
      if (((_outh & 3U) != 0) || (_outh / iVar41 != local_c0)) goto LAB_0028f95c;
      if (pMVar39 != pMVar3) {
        piVar4 = pMVar3->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar39->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = pMVar39->data;
            pAVar7 = pMVar39->allocator;
            if (pAVar7 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outh % (long)iVar41 & 0xffffffff);
            }
          }
        }
        pMVar39->cstep = 0;
        pMVar39->data = (void *)0x0;
        pMVar39->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
        pMVar39->dims = 0;
        pMVar39->w = 0;
        pMVar39->h = 0;
        pMVar39->d = 0;
        pMVar39->c = 0;
        piVar4 = pMVar3->refcount;
        pMVar39->data = pMVar3->data;
        pMVar39->refcount = piVar4;
        pMVar39->elemsize = pMVar3->elemsize;
        pMVar39->elempack = pMVar3->elempack;
        pMVar39->allocator = pMVar3->allocator;
        iVar35 = pMVar3->w;
        iVar41 = pMVar3->h;
        iVar29 = pMVar3->d;
        pMVar39->dims = pMVar3->dims;
        pMVar39->w = iVar35;
        pMVar39->h = iVar41;
        pMVar39->d = iVar29;
        pMVar39->c = pMVar3->c;
        pMVar39->cstep = pMVar3->cstep;
      }
LAB_0028fa45:
      bVar43 = false;
      iVar35 = 0;
    }
    else {
LAB_0028f95c:
      bVar43 = true;
      if (((_hoffset | _outh) & 3U) == 0) {
        Mat::create(pMVar39,_outw,_outh / iVar41,(local_b0 >> 2) << bVar42 * '\x02',iVar41,
                    local_c8->blob_allocator);
        iVar35 = -100;
        if (pMVar39->data == (void *)0x0) {
          bVar43 = false;
        }
        else {
          bVar43 = false;
          if ((long)pMVar39->c * pMVar39->cstep != 0) {
            iVar35 = _hoffset + 3;
            if (-1 < _hoffset) {
              iVar35 = _hoffset;
            }
            crop_pack4_sse(pMVar3,pMVar39,iVar35 >> 2,_woffset);
            goto LAB_0028fa45;
          }
        }
      }
    }
    if (!bVar43) {
      return iVar35;
    }
  }
  if (local_cc == 3) {
    bVar42 = (_outc & 3U) == 0;
    iVar41 = (uint)bVar42 * 3 + 1;
    uVar38 = local_b0 >> 2;
    bVar43 = _outh != local_c0 || _outw != local_d0;
    if (bVar43) {
LAB_0028fb02:
      bVar28 = true;
      if (((_coffset | _outc) & 3U) == 0) {
        m.c = _outc / iVar41;
        uVar8 = pMVar3->elemsize;
        m.data = (void *)((long)(_coffset / iVar41) * pMVar3->cstep * uVar8 + (long)pMVar3->data);
        m.elempack = pMVar3->elempack;
        m.allocator = pMVar3->allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = (int)uVar8;
        m.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
        uVar15 = pMVar3->dims;
        uVar16 = pMVar3->w;
        uVar17 = pMVar3->h;
        uVar18 = pMVar3->d;
        m.cstep = ((long)pMVar3->d * uVar8 * (long)pMVar3->h * (long)pMVar3->w + 0xf &
                  0xfffffffffffffff0) / uVar8;
        m.dims = uVar15;
        m.w = uVar16;
        m.h = uVar17;
        m.d = uVar18;
        if (bVar43) {
LAB_0028fd66:
          Mat::create(pMVar39,_outw,_outh,_outc / iVar41,uVar38 << bVar42 * '\x02',iVar41,
                      local_c8->blob_allocator);
          iVar35 = -100;
          if ((pMVar39->data != (void *)0x0) && ((long)pMVar39->c * pMVar39->cstep != 0)) {
            if (pMVar39->c < 1) {
              iVar35 = 0;
            }
            else {
              lVar36 = 0;
              do {
                pAVar7 = m.allocator;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start =
                     (pointer)(m.cstep * lVar36 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize) +
                              (long)m.data);
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish._0_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish._4_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                local_118 = m.allocator;
                sVar9 = local_d8->elemsize;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)(local_d8->cstep * lVar36 * sVar9 + (long)local_d8->data);
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar9;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     (undefined4)(sVar9 >> 0x20);
                crop_pack4_sse((Mat *)&bottom_blob_shapes,(Mat *)&bottom_blobs_unpacked,_hoffset,
                               _woffset);
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                         bottom_blob_shapes.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_finish._0_4_);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + -1;
                  UNLOCK();
                  if (*piVar4 == 0) {
                    if (pAVar7 == (Allocator *)0x0) {
                      if (bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        free(bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start);
                      }
                    }
                    else {
                      (*pAVar7->_vptr_Allocator[3])();
                    }
                  }
                }
                local_f8 = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_start = (pointer)0x0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish._0_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_finish._4_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                iStack_120 = 0;
                iStack_110 = 0;
                iStack_10c = 0;
                iStack_108 = 0;
                iStack_104 = 0;
                iStack_100 = 0;
                lVar36 = lVar36 + 1;
              } while (lVar36 < local_d8->c);
              iVar35 = 0;
              pMVar39 = local_d8;
            }
          }
        }
        else {
          Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_c8->blob_allocator,(int)m.elemsize,
                     m.allocator);
          pMVar39 = local_d8;
          if (local_d8 != (Mat *)&bottom_blob_shapes) {
            piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = local_d8->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_d8->allocator == (Allocator *)0x0) {
                  if (local_d8->data != (void *)0x0) {
                    free(local_d8->data);
                  }
                }
                else {
                  (*local_d8->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar39->cstep = 0;
            pMVar39->data = (void *)0x0;
            pMVar39->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
            pMVar39->dims = 0;
            pMVar39->w = 0;
            pMVar39->h = 0;
            pMVar39->d = 0;
            pMVar39->c = 0;
            pMVar39->data =
                 bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            pMVar39->refcount =
                 (int *)CONCAT44(bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,
                                 bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._0_4_);
            pMVar39->elemsize =
                 CONCAT44(bottom_blob_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_,
                          (int)bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
            pMVar39->elempack = iStack_120;
            pMVar39->allocator = local_118;
            pMVar39->dims = iStack_110;
            pMVar39->w = iStack_10c;
            pMVar39->h = iStack_108;
            pMVar39->d = iStack_104;
            pMVar39->c = iStack_100;
            pMVar39->cstep = local_f8;
          }
          piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_118 == (Allocator *)0x0) {
                if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
              }
              else {
                (*local_118->_vptr_Allocator[3])();
              }
            }
          }
          iVar35 = -100;
          if ((pMVar39->data != (void *)0x0) && ((long)pMVar39->c * pMVar39->cstep != 0))
          goto LAB_0028fd66;
        }
        piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m.cstep = 0;
        m.data = (void *)0x0;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.elemsize._0_4_ = 0;
        m.elemsize._4_4_ = 0;
        m.elempack = 0;
        m.dims = 0;
        m.w = 0;
        m.h = 0;
        m.d = 0;
        m.c = 0;
        bVar28 = false;
      }
    }
    else {
      if (((_outc & 3U) != 0) || (_outc / iVar41 != local_b8)) goto LAB_0028fb02;
      if (pMVar39 != pMVar3) {
        piVar4 = pMVar3->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = pMVar39->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = pMVar39->data;
            pAVar7 = pMVar39->allocator;
            if (pAVar7 == (Allocator *)0x0) {
              if (pvVar5 != (void *)0x0) {
                free(pvVar5);
              }
            }
            else {
              (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outc % (long)iVar41 & 0xffffffff);
            }
          }
        }
        pMVar39->cstep = 0;
        pMVar39->data = (void *)0x0;
        pMVar39->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
        pMVar39->dims = 0;
        pMVar39->w = 0;
        pMVar39->h = 0;
        pMVar39->d = 0;
        pMVar39->c = 0;
        piVar4 = pMVar3->refcount;
        pMVar39->data = pMVar3->data;
        pMVar39->refcount = piVar4;
        pMVar39->elemsize = pMVar3->elemsize;
        pMVar39->elempack = pMVar3->elempack;
        pMVar39->allocator = pMVar3->allocator;
        iVar35 = pMVar3->w;
        iVar41 = pMVar3->h;
        iVar29 = pMVar3->d;
        pMVar39->dims = pMVar3->dims;
        pMVar39->w = iVar35;
        pMVar39->h = iVar41;
        pMVar39->d = iVar29;
        pMVar39->c = pMVar3->c;
        pMVar39->cstep = pMVar3->cstep;
      }
      bVar28 = false;
      iVar35 = 0;
    }
    if (!bVar28) {
      return iVar35;
    }
  }
  if (local_cc != 4) goto LAB_002906fb;
  bVar42 = (_outc & 3U) == 0;
  iVar41 = (uint)bVar42 * 3 + 1;
  uVar38 = local_b0 >> 2;
  bVar43 = iVar32 != _outd || (local_c0 != _outh || local_d0 != _outw);
  if (bVar43) {
LAB_00290160:
    bVar28 = true;
    if (((_coffset | _outc) & 3U) == 0) {
      m.c = _outc / iVar41;
      uVar8 = pMVar3->elemsize;
      m.data = (void *)((long)(_coffset / iVar41) * pMVar3->cstep * uVar8 + (long)pMVar3->data);
      m.elempack = pMVar3->elempack;
      m.allocator = pMVar3->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (int)uVar8;
      m.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
      uVar24 = pMVar3->dims;
      uVar25 = pMVar3->w;
      uVar26 = pMVar3->h;
      uVar27 = pMVar3->d;
      m.cstep = ((long)pMVar3->d * uVar8 * (long)pMVar3->h * (long)pMVar3->w + 0xf &
                0xfffffffffffffff0) / uVar8;
      m.dims = uVar24;
      m.w = uVar25;
      m.h = uVar26;
      m.d = uVar27;
      if (bVar43) {
LAB_002903b9:
        Mat::create(pMVar39,_outw,_outh,_outd,_outc / iVar41,uVar38 << bVar42 * '\x02',iVar41,
                    local_c8->blob_allocator);
        iVar35 = -100;
        if ((pMVar39->data != (void *)0x0) && ((long)pMVar39->c * pMVar39->cstep != 0)) {
          if (pMVar39->c < 1) {
            iVar35 = 0;
          }
          else {
            lVar36 = 0;
            do {
              if (0 < _outd) {
                lVar37 = 0;
                do {
                  pAVar30 = m.allocator;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)((long)m.data +
                                (long)(_doffset + (int)lVar37) *
                                CONCAT44(m.elemsize._4_4_,(int)m.elemsize) * (long)m.h * (long)m.w +
                                m.cstep * lVar36 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize));
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                  sVar9 = local_d8->elemsize;
                  pAVar7 = local_d8->allocator;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)((long)local_d8->data +
                                lVar37 * sVar9 * (long)local_d8->h * (long)local_d8->w +
                                local_d8->cstep * lVar36 * sVar9);
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar9;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                       (undefined4)(sVar9 >> 0x20);
                  crop_pack4_sse((Mat *)&bottom_blob_shapes,(Mat *)&bottom_blobs_unpacked,_hoffset,
                                 _woffset);
                  piVar4 = (int *)CONCAT44(bottom_blobs_unpacked.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blobs_unpacked.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (pAVar7 == (Allocator *)0x0) {
                        if (bottom_blobs_unpacked.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blobs_unpacked.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar7->_vptr_Allocator[3])();
                      }
                    }
                  }
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (pAVar30 == (Allocator *)0x0) {
                        if (bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar30->_vptr_Allocator[3])();
                      }
                    }
                  }
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  lVar37 = lVar37 + 1;
                } while (lVar37 < _outd);
              }
              lVar36 = lVar36 + 1;
            } while (lVar36 < local_d8->c);
            iVar35 = 0;
          }
        }
      }
      else {
        Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,local_c8->blob_allocator,(int)m.elemsize,
                   m.allocator);
        if (pMVar39 != (Mat *)&bottom_blob_shapes) {
          piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = pMVar39->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (pMVar39->allocator == (Allocator *)0x0) {
                if (pMVar39->data != (void *)0x0) {
                  free(pMVar39->data);
                }
              }
              else {
                (*pMVar39->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar39->cstep = 0;
          pMVar39->data = (void *)0x0;
          pMVar39->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
          pMVar39->dims = 0;
          pMVar39->w = 0;
          pMVar39->h = 0;
          pMVar39->d = 0;
          pMVar39->c = 0;
          pMVar39->data =
               bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
          pMVar39->refcount =
               (int *)CONCAT44(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish._4_4_,
                               bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish._0_4_);
          pMVar39->elemsize =
               CONCAT44(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                        (int)bottom_blob_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
          pMVar39->elempack = iStack_120;
          pMVar39->allocator = local_118;
          pMVar39->dims = iStack_110;
          pMVar39->w = iStack_10c;
          pMVar39->h = iStack_108;
          pMVar39->d = iStack_104;
          pMVar39->c = iStack_100;
          pMVar39->cstep = local_f8;
        }
        piVar4 = (int *)CONCAT44(bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,
                                 bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_118 == (Allocator *)0x0) {
              if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                free(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              (*local_118->_vptr_Allocator[3])();
            }
          }
        }
        iVar35 = -100;
        if ((pMVar39->data != (void *)0x0) && ((long)pMVar39->c * pMVar39->cstep != 0))
        goto LAB_002903b9;
      }
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      bVar28 = false;
    }
  }
  else {
    if (((_outc & 3U) != 0) || (_outc / iVar41 != local_b8)) goto LAB_00290160;
    if (pMVar39 != pMVar3) {
      piVar4 = pMVar3->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = pMVar39->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = pMVar39->data;
          pAVar7 = pMVar39->allocator;
          if (pAVar7 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar7->_vptr_Allocator[3])(pAVar7,pvVar5,(long)_outc % (long)iVar41 & 0xffffffff);
          }
        }
      }
      pMVar39->cstep = 0;
      pMVar39->data = (void *)0x0;
      pMVar39->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
      pMVar39->dims = 0;
      pMVar39->w = 0;
      pMVar39->h = 0;
      pMVar39->d = 0;
      pMVar39->c = 0;
      piVar4 = pMVar3->refcount;
      pMVar39->data = pMVar3->data;
      pMVar39->refcount = piVar4;
      pMVar39->elemsize = pMVar3->elemsize;
      pMVar39->elempack = pMVar3->elempack;
      pMVar39->allocator = pMVar3->allocator;
      iVar32 = pMVar3->w;
      iVar35 = pMVar3->h;
      iVar41 = pMVar3->d;
      pMVar39->dims = pMVar3->dims;
      pMVar39->w = iVar32;
      pMVar39->h = iVar35;
      pMVar39->d = iVar41;
      pMVar39->c = pMVar3->c;
      pMVar39->cstep = pMVar3->cstep;
    }
    bVar28 = false;
    iVar35 = 0;
  }
  if (!bVar28) {
    return iVar35;
  }
LAB_002906fb:
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blobs_unpacked,
             ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7,
             (allocator_type *)&m);
  pMVar33 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  bVar42 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_finish != pMVar33;
  local_d8._0_4_ = iVar35;
  if (bVar42) {
    lVar36 = 0;
    uVar38 = 0;
    do {
      piVar4 = *(int **)((long)&pMVar33->refcount + lVar36);
      puVar1 = (undefined8 *)((long)&pMVar33->data + lVar36);
      m.data = (void *)*puVar1;
      uVar10 = puVar1[1];
      m.refcount._0_4_ = (undefined4)uVar10;
      m.refcount._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
      uVar10 = *(undefined8 *)((long)&pMVar33->elemsize + lVar36);
      m.elemsize._0_4_ = (int)uVar10;
      m.elemsize._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
      m.elempack = *(int *)((long)&pMVar33->elempack + lVar36);
      m.allocator = *(Allocator **)((long)&pMVar33->allocator + lVar36);
      puVar1 = (undefined8 *)((long)&pMVar33->dims + lVar36);
      uVar10 = *puVar1;
      uVar19 = puVar1[1];
      m.dims = (int)uVar10;
      m.w = (int)((ulong)uVar10 >> 0x20);
      m.h = (int)uVar19;
      m.d = (int)((ulong)uVar19 >> 0x20);
      m.c = *(int *)((long)&pMVar33->c + lVar36);
      m.cstep = *(size_t *)((long)&pMVar33->cstep + lVar36);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      if (iVar2 == 1) {
LAB_0029082f:
        pMVar33 = bottom_blobs_unpacked.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pMVar3 = (Mat *)((long)&(bottom_blobs_unpacked.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_start)->data + lVar36);
        bVar43 = true;
        if (pMVar3 != &m) {
          piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = *(int **)((long)&(bottom_blobs_unpacked.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->refcount + lVar36);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              pvVar5 = *(void **)((long)&(bottom_blobs_unpacked.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->data + lVar36);
              plVar6 = *(long **)((long)&(bottom_blobs_unpacked.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->allocator +
                                 lVar36);
              if (plVar6 == (long *)0x0) {
                if (pvVar5 != (void *)0x0) {
                  free(pvVar5);
                }
              }
              else {
                (**(code **)(*plVar6 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar33->cstep + lVar36) = 0;
          *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
          pMVar3->data = (void *)0x0;
          pMVar3->refcount = (int *)0x0;
          puVar1 = (undefined8 *)((long)&pMVar33->dims + lVar36);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&pMVar33->c + lVar36) = 0;
          puVar1 = (undefined8 *)((long)&pMVar33->data + lVar36);
          *puVar1 = m.data;
          puVar1[1] = CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          *(ulong *)((long)&pMVar33->elemsize + lVar36) = CONCAT44(m.elemsize._4_4_,(int)m.elemsize)
          ;
          *(int *)((long)&pMVar33->elempack + lVar36) = m.elempack;
          *(Allocator **)((long)&pMVar33->allocator + lVar36) = m.allocator;
          puVar1 = (undefined8 *)((long)&pMVar33->dims + lVar36);
          *puVar1 = CONCAT44(m.w,m.dims);
          puVar1[1] = CONCAT44(m.d,m.h);
          *(int *)((long)&pMVar33->c + lVar36) = m.c;
          *(size_t *)((long)&pMVar33->cstep + lVar36) = m.cstep;
        }
      }
      else {
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)local_c8;
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (int)local_c8->workspace_allocator;
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             (undefined4)((ulong)local_c8->workspace_allocator >> 0x20);
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = SUB84(local_c8->workspace_allocator,0);
        bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ =
             (undefined4)((ulong)local_c8->workspace_allocator >> 0x20);
        convert_packing((Mat *)((long)&((bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_start)->data + lVar36),&m
                        ,1,(Option *)&bottom_blob_shapes);
        if (m.data != (void *)0x0 && (long)m.c * m.cstep != 0) goto LAB_0029082f;
        local_d8._0_4_ = -100;
        bVar43 = false;
      }
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      if (!bVar43) break;
      uVar38 = uVar38 + 1;
      pMVar33 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar36 = lVar36 + 0x48;
      bVar42 = uVar38 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar33 >>
                                3) * -0x71c71c71c71c71c7);
    } while (bVar42);
  }
  iVar32 = (int)local_d8;
  if (!bVar42) {
    iVar32 = Crop::forward(&this->super_Crop,&bottom_blobs_unpacked,top_blobs,local_c8);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs_unpacked);
  return iVar32;
}

Assistant:

int Crop_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    Mat& top_blob = top_blobs[0];

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(bottom_blobs.size());
        for (size_t i = 0; i < bottom_blobs.size(); i++)
        {
            bottom_blob_shapes[i] = bottom_blobs[i].shape();
        }
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    std::vector<Mat> bottom_blobs_unpacked(bottom_blobs.size());
    for (size_t i = 0; i < bottom_blobs.size(); i++)
    {
        Mat bottom_blob_unpacked = bottom_blobs[i];
        if (elempack != 1)
        {
            Option opt_pack1 = opt;
            opt_pack1.blob_allocator = opt.workspace_allocator;

            convert_packing(bottom_blobs[i], bottom_blob_unpacked, 1, opt_pack1);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        bottom_blobs_unpacked[i] = bottom_blob_unpacked;
    }

    return Crop::forward(bottom_blobs_unpacked, top_blobs, opt);
}